

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O0

int __thiscall
Multiqueues<int>::getQueueIndexForDelete(Multiqueues<int> *this,int queueIndex,int secondQueueIndex)

{
  bool bVar1;
  value_type *pvVar2;
  int in_EDX;
  int in_ESI;
  int value2;
  int value;
  undefined4 in_stack_ffffffffffffffe0;
  value_type vVar3;
  undefined4 in_stack_ffffffffffffffe4;
  value_type vVar4;
  int local_14;
  int local_4;
  
  bVar1 = boost::heap::
          d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                   *)0x10584f);
  if ((bVar1) &&
     (bVar1 = boost::heap::
              d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
              ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                       *)0x10586e), bVar1)) {
    local_4 = -1;
  }
  else {
    bVar1 = boost::heap::
            d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
            ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                     *)0x10589a);
    if ((!bVar1) ||
       (bVar1 = boost::heap::
                d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                         *)0x1058b9), local_14 = in_EDX, bVar1)) {
      do {
        bVar1 = std::mutex::try_lock
                          ((mutex *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      vVar4 = -1;
      bVar1 = boost::heap::
              d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
              ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                       *)0x105910);
      if (!bVar1) {
        pvVar2 = boost::heap::
                 d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                 ::top((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                        *)0x10592d);
        vVar4 = *pvVar2;
      }
      std::mutex::unlock((mutex *)0x10594c);
      do {
        bVar1 = std::mutex::try_lock((mutex *)CONCAT44(vVar4,in_stack_ffffffffffffffe0));
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      vVar3 = -1;
      bVar1 = boost::heap::
              d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
              ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                       *)0x105990);
      if (!bVar1) {
        pvVar2 = boost::heap::
                 d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                 ::top((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                        *)0x1059ad);
        vVar3 = *pvVar2;
      }
      std::mutex::unlock((mutex *)0x1059cc);
      local_14 = in_ESI;
      if (vVar4 < vVar3) {
        local_14 = in_EDX;
      }
    }
    if ((local_14 == -1) ||
       (bVar1 = boost::heap::
                d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                         *)0x105a02), !bVar1)) {
      local_4 = local_14;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int getQueueIndexForDelete(int queueIndex, int secondQueueIndex) const {
        if (internalQueues[queueIndex].empty() && internalQueues[secondQueueIndex].empty()) {
            return -1;
        } else if (internalQueues[queueIndex].empty() && !internalQueues[secondQueueIndex].empty()) {
            queueIndex = secondQueueIndex;
        } else {
            while (!locks[queueIndex].try_lock());
            int value = -1;
            if (!internalQueues[queueIndex].empty())
                value = internalQueues[queueIndex].top();
            locks[queueIndex].unlock();
            while (!locks[secondQueueIndex].try_lock());
            int value2 = -1;
            if (!internalQueues[secondQueueIndex].empty())
                value2 = internalQueues[secondQueueIndex].top();
            locks[secondQueueIndex].unlock();
            if (value2 > value) {
                queueIndex = secondQueueIndex;
            }
        }

        if (queueIndex != -1 && internalQueues[queueIndex].empty()) {
            return -1;
        }
        return queueIndex;
    }